

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_array.h
# Opt level: O3

bool Search::must_run_test(vw *all,multi_ex *ec,bool is_test_ex)

{
  shared_data *psVar1;
  byte bVar2;
  
  if ((all->final_prediction_sink)._end == (all->final_prediction_sink)._begin) {
    psVar1 = all->sd;
    if ((psVar1->weighted_labeled_examples + psVar1->weighted_unlabeled_examples + 1.0 <
         (double)psVar1->dump_interval) || (all->quiet != false)) {
      bVar2 = 0;
    }
    else {
      bVar2 = all->bfgs ^ 1;
    }
    if (((bVar2 == 0) && (all->raw_prediction < 1)) && ((!is_test_ex | all->vw_is_main) == 1)) {
      if (all->quiet == true) {
        if (all->vw_is_main != false || is_test_ex) {
          return false;
        }
      }
      else if (is_test_ex) {
        return false;
      }
      if ((all->holdout_set_off == false) &&
         ((*(ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_start)->test_only == false)) {
        return all->current_pass == 0;
      }
    }
  }
  return true;
}

Assistant:

inline size_t size() const { return _end - _begin; }